

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ClipControlDepthModeZeroToOneTest::deinit(ClipControlDepthModeZeroToOneTest *this)

{
  API AVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ClipControlApi cc;
  ClipControlApi local_30;
  long lVar4;
  
  ClipControlRenderBaseTest::deinit(&this->super_ClipControlRenderBaseTest);
  iVar3 = (*((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
            m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  AVar1 = (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api;
  if ((AVar1 == API_GL_45core) ||
     ((AVar1 == API_GL_ARB_clip_control &&
      (bVar2 = glu::ContextInfo::isExtensionSupported
                         (((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.
                           super_TestCase.m_context)->m_contextInfo,"GL_ARB_clip_control"), bVar2)))
     ) {
    ClipControlApi::ClipControlApi
              (&local_30,
               (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
               m_context,(this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api);
    (*local_30.clipControl)(0x8ca1,0x935e);
  }
  (**(code **)(lVar4 + 0x1c8))(0);
  (**(code **)(lVar4 + 0x1c0))(0,0,0,0);
  (**(code **)(lVar4 + 0x4e8))(0xb71);
  (**(code **)(lVar4 + 0x4a0))(0x201);
  if (this->m_vao != 0) {
    (**(code **)(lVar4 + 0x490))(1,&this->m_vao);
  }
  if (this->m_vbo != 0) {
    (**(code **)(lVar4 + 0x438))(1,&this->m_vbo);
  }
  return;
}

Assistant:

void deinit()
	{
		ClipControlRenderBaseTest::deinit();

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		if (ClipControlApi::Supported(m_context, m_api))
		{
			ClipControlApi cc(m_context, m_api);
			cc.clipControl(GL_LOWER_LEFT, GL_NEGATIVE_ONE_TO_ONE);
		}

		gl.clearDepth(0.0);
		gl.clearColor(0.0, 0.0, 0.0, 0.0);

		gl.disable(GL_DEPTH_TEST);
		gl.depthFunc(GL_LESS);

		if (m_vao)
		{
			gl.deleteVertexArrays(1, &m_vao);
		}
		if (m_vbo)
		{
			gl.deleteBuffers(1, &m_vbo);
		}
	}